

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_BinaryEqualLast_Test::testBody(TEST_TestFailure_BinaryEqualLast_Test *this)

{
  undefined *fileName;
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  undefined1 local_b8 [56];
  BinaryEqualFailure f;
  uchar actualData [7];
  uchar expectedData [7];
  TEST_TestFailure_BinaryEqualLast_Test *this_local;
  
  fileName = (anonymous_namespace)::failFileName;
  actualData[4] = '\0';
  actualData[5] = '\0';
  actualData[6] = '\0';
  actualData[0] = '\0';
  actualData[1] = '\0';
  actualData[2] = '\0';
  actualData[3] = '\0';
  f.super_TestFailure.message_.bufferSize_._4_3_ = 0x10000;
  f.super_TestFailure.message_.bufferSize_._0_4_ = 0;
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)(local_b8 + 0x20),"");
  BinaryEqualFailure::BinaryEqualFailure
            ((BinaryEqualFailure *)(local_b8 + 0x30),pUVar1,fileName,2,actualData,
             (uchar *)&f.super_TestFailure.message_.bufferSize_,7,(SimpleString *)(local_b8 + 0x20))
  ;
  SimpleString::~SimpleString((SimpleString *)(local_b8 + 0x20));
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b8);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_b8);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <00 00 00 00 00 00 00>\n\tbut was  <00 00 00 00 00 00 01>\n\tdifference starts at position 6 at: <00 00 00 01         >\n\t                                               ^"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
             ,0x176,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_b8);
  BinaryEqualFailure::~BinaryEqualFailure((BinaryEqualFailure *)(local_b8 + 0x30));
  return;
}

Assistant:

TEST(TestFailure, BinaryEqualLast)
{
    const unsigned char expectedData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
	const unsigned char actualData[] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01};
    BinaryEqualFailure f(test, failFileName, failLineNumber, expectedData, actualData, sizeof(expectedData), "");
    FAILURE_EQUAL("expected <00 00 00 00 00 00 00>\n"
                "\tbut was  <00 00 00 00 00 00 01>\n"
    			"\tdifference starts at position 6 at: <00 00 00 01         >\n"
    			"\t                                               ^", f);
}